

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrLocateSpace
                   (XrSpace space,XrSpace baseSpace,XrTime time,XrSpaceLocation *location)

{
  GenValidUsageXrInstanceInfo *pGVar1;
  bool bVar2;
  ValidateXrHandleResult VVar3;
  uint64_t handle1;
  uint64_t handle2;
  ostream *poVar4;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar5;
  allocator local_859;
  string local_858 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_838;
  allocator local_819;
  string local_818 [39];
  allocator local_7f1;
  string local_7f0 [39];
  allocator local_7c9;
  string local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_780;
  allocator local_761;
  string local_760 [39];
  allocator local_739;
  string local_738 [32];
  string local_718 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_6f8;
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [32];
  XrSpace_T local_690 [32];
  XrSpace_T local_670 [32];
  ostringstream local_650 [8];
  ostringstream oss_error;
  string local_4d8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_4b8;
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [32];
  XrSpace_T local_450 [32];
  ostringstream local_430 [8];
  ostringstream oss_1;
  XrObjectType local_2b4;
  ValidateXrHandleResult handle_result_1;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_space_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_288 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  XrSpace_T local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_54;
  undefined1 local_50 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrSpaceLocation *location_local;
  XrTime time_local;
  XrSpace baseSpace_local;
  XrSpace space_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  time_local = (XrTime)baseSpace;
  baseSpace_local = space;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  local_54 = XR_OBJECT_TYPE_SPACE;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSpace_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_50
             ,&baseSpace_local,&local_54);
  VVar3 = VerifyXrSpaceHandle(&baseSpace_local);
  if (VVar3 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar5 = HandleInfo<XrSpace_T_*>::getWithInstanceInfo(&g_space_info,baseSpace_local);
    _handle_result_1 = pVar5.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar5.first;
    local_2b4 = XR_OBJECT_TYPE_SPACE;
    gen_space_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)_handle_result_1;
    std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
    emplace_back<XrSpace_T*&,XrObjectType>
              ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
               local_50,(XrSpace_T **)&time_local,&local_2b4);
    VVar3 = VerifyXrSpaceHandle((XrSpace *)&time_local);
    if (VVar3 == VALIDATE_XR_HANDLE_SUCCESS) {
      handle1 = MakeHandleGeneric<XrSpace_T*>(baseSpace_local);
      handle2 = MakeHandleGeneric<XrSpace_T*>((XrSpace_T *)time_local);
      bVar2 = VerifyXrParent(XR_OBJECT_TYPE_SPACE,handle1,XR_OBJECT_TYPE_SPACE,handle2,false);
      pGVar1 = _handle_result_1;
      if (bVar2) {
        if (location == (XrSpaceLocation *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_738,"VUID-xrLocateSpace-location-parameter",&local_739)
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_760,"xrLocateSpace",&local_761);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_780,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_7a0,
                     "Invalid NULL for XrSpaceLocation \"location\" which is not optional and must be non-NULL"
                     ,&local_7a1);
          CoreValidLogMessage(pGVar1,(string *)local_738,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_760,&local_780,(string *)local_7a0);
          std::__cxx11::string::~string(local_7a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_780);
          std::__cxx11::string::~string(local_760);
          std::allocator<char>::~allocator((allocator<char> *)&local_761);
          std::__cxx11::string::~string(local_738);
          std::allocator<char>::~allocator((allocator<char> *)&local_739);
          space_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          info_with_instance.second._4_4_ = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7c8,"xrLocateSpace",&local_7c9);
          objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               ValidateXrStruct(pGVar1,(string *)local_7c8,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)local_50,false,true,location);
          std::__cxx11::string::~string(local_7c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
          pGVar1 = _handle_result_1;
          if (objects_info.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
            space_local._4_4_ =
                 objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            info_with_instance.second._4_4_ = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_7f0,"VUID-xrLocateSpace-location-parameter",&local_7f1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_818,"xrLocateSpace",&local_819);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_838,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_858,"Command xrLocateSpace param location is invalid",&local_859);
            CoreValidLogMessage(pGVar1,(string *)local_7f0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                (string *)local_818,&local_838,(string *)local_858);
            std::__cxx11::string::~string(local_858);
            std::allocator<char>::~allocator((allocator<char> *)&local_859);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_838);
            std::__cxx11::string::~string(local_818);
            std::allocator<char>::~allocator((allocator<char> *)&local_819);
            std::__cxx11::string::~string(local_7f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
            space_local._4_4_ =
                 objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            info_with_instance.second._4_4_ = 1;
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_650);
        poVar4 = std::operator<<((ostream *)local_650,"XrSpace ");
        HandleToHexString<XrSpace_T*>(local_670);
        std::operator<<(poVar4,(string *)local_670);
        std::__cxx11::string::~string((string *)local_670);
        std::operator<<((ostream *)local_650," and XrSpace ");
        HandleToHexString<XrSpace_T*>(local_690);
        std::operator<<((ostream *)local_650,(string *)local_690);
        std::__cxx11::string::~string((string *)local_690);
        std::operator<<((ostream *)local_650," must share a parent");
        pGVar1 = _handle_result_1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6b0,"VUID-xrLocateSpace-commonparent",&local_6b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6d8,"xrLocateSpace",&local_6d9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_6f8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
        std::__cxx11::ostringstream::str();
        CoreValidLogMessage(pGVar1,(string *)local_6b0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_6d8,&local_6f8,local_718);
        std::__cxx11::string::~string((string *)local_718);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_6f8);
        std::__cxx11::string::~string(local_6d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
        std::__cxx11::string::~string(local_6b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
        space_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        info_with_instance.second._4_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream(local_650);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_430);
      std::operator<<((ostream *)local_430,"Invalid XrSpace handle \"baseSpace\" ");
      HandleToHexString<XrSpace_T*>(local_450);
      std::operator<<((ostream *)local_430,(string *)local_450);
      std::__cxx11::string::~string((string *)local_450);
      pGVar1 = _handle_result_1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_470,"VUID-xrLocateSpace-baseSpace-parameter",&local_471);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_498,"xrLocateSpace",&local_499);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_4b8,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_50);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(pGVar1,(string *)local_470,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_498,&local_4b8,local_4d8);
      std::__cxx11::string::~string((string *)local_4d8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_4b8);
      std::__cxx11::string::~string(local_498);
      std::allocator<char>::~allocator((allocator<char> *)&local_499);
      std::__cxx11::string::~string(local_470);
      std::allocator<char>::~allocator((allocator<char> *)&local_471);
      space_local._4_4_ = XR_ERROR_HANDLE_INVALID;
      info_with_instance.second._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream(local_430);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,"Invalid XrSpace handle \"space\" ");
    HandleToHexString<XrSpace_T*>(local_200);
    std::operator<<((ostream *)local_1e0,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"VUID-xrLocateSpace-space-parameter",&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"xrLocateSpace",&local_249);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_268,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_50);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_220,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_248,&local_268,local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_268);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    space_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  return space_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrLocateSpace(
XrSpace space,
XrSpace baseSpace,
XrTime time,
XrSpaceLocation* location) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(space, XR_OBJECT_TYPE_SPACE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&space);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpace handle \"space\" ";
                oss << HandleToHexString(space);
                CoreValidLogMessage(nullptr, "VUID-xrLocateSpace-space-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSpace",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_space_info.getWithInstanceInfo(space);
        GenValidUsageXrHandleInfo *gen_space_info = info_with_instance.first;
        (void)gen_space_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        objects_info.emplace_back(baseSpace, XR_OBJECT_TYPE_SPACE);
        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&baseSpace);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpace handle \"baseSpace\" ";
                oss << HandleToHexString(baseSpace);
                CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSpace-baseSpace-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSpace",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        // Verify that the handles share a common ancestry
        if (!VerifyXrParent(XR_OBJECT_TYPE_SPACE,  MakeHandleGeneric(space),
                    XR_OBJECT_TYPE_SPACE,  MakeHandleGeneric(baseSpace), false)) {
            std::ostringstream oss_error;
            oss_error << "XrSpace " << HandleToHexString(space);
            oss_error <<  " and XrSpace ";
            oss_error << HandleToHexString(baseSpace);
            oss_error <<  " must share a parent";
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSpace-commonparent",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSpace",
                                objects_info, oss_error.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == location) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSpace-location-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSpace", objects_info,
                                "Invalid NULL for XrSpaceLocation \"location\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSpaceLocation is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrLocateSpace", objects_info,
                                                        false, true, location);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSpace-location-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSpace",
                                objects_info,
                                "Command xrLocateSpace param location is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}